

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_str2addr(char *str,char **endp,sockaddr_can *can)

{
  int iVar1;
  char *pcVar2;
  ulonglong uVar3;
  ulong uVar4;
  size_t sVar5;
  char *__nptr;
  char **__endptr;
  char tmp [16];
  char *p;
  
  __endptr = &p;
  if (endp != (char **)0x0) {
    __endptr = endp;
  }
  *(undefined8 *)((long)&can->can_addr + 8) = 0;
  can->can_family = 0;
  *(undefined2 *)&can->field_0x2 = 0;
  can->can_ifindex = 0;
  (can->can_addr).j1939.name = 0;
  can->can_family = 0x1d;
  (can->can_addr).j1939.addr = 0xff;
  (can->can_addr).j1939.pgn = 0x40000;
  pcVar2 = strchr(str,0x3a);
  if (pcVar2 == (char *)0x0) {
    iVar1 = libj1939_ifindex(str);
    can->can_ifindex = iVar1;
    if (iVar1 != 0) {
      sVar5 = strlen(str);
      *__endptr = str + sVar5;
      return 0;
    }
  }
  else {
    sVar5 = (long)pcVar2 - (long)str;
    if (0xf < (long)sVar5) {
      return -1;
    }
    strncpy(tmp,str,sVar5);
    tmp[sVar5] = '\0';
    iVar1 = libj1939_ifindex(tmp);
    can->can_ifindex = iVar1;
  }
  __nptr = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    __nptr = str;
  }
  uVar3 = strtoull(__nptr,__endptr,0x10);
  if (__nptr < *__endptr) {
    if ((long)*__endptr - (long)__nptr == 2) {
      (can->can_addr).j1939.addr = (__u8)uVar3;
    }
    else {
      (can->can_addr).j1939.name = uVar3;
    }
    if ((**__endptr != '\0') &&
       (pcVar2 = *__endptr + 1, uVar4 = strtoul(pcVar2,__endptr,0x10), pcVar2 < *__endptr)) {
      (can->can_addr).j1939.pgn = (__u32)uVar4;
    }
  }
  return 0;
}

Assistant:

int libj1939_str2addr(const char *str, char **endp, struct sockaddr_can *can)
{
	char *p;
	const char *pstr;
	uint64_t tmp64;
	unsigned long tmp;

	if (!endp)
		endp = &p;
	memset(can, 0, sizeof(*can));
	can->can_family = AF_CAN;
	can->can_addr.j1939.name = J1939_NO_NAME;
	can->can_addr.j1939.addr = J1939_NO_ADDR;
	can->can_addr.j1939.pgn = J1939_NO_PGN;

	pstr = strchr(str, ':');
	if (pstr) {
		char tmp[IFNAMSIZ];
		if ((pstr - str) >= IFNAMSIZ)
			return -1;
		strncpy(tmp, str, pstr - str);
		tmp[pstr - str] = 0;
		can->can_ifindex = libj1939_ifindex(tmp);
	} else {
		can->can_ifindex = libj1939_ifindex(str);
		if (can->can_ifindex) {
			if (endp)
				*endp = (char *)&str[strlen(str)];
			return 0;
		}
	}
	if (pstr)
		++pstr;
	else
		pstr = str;


	tmp64 = strtoull(pstr, endp, 16);
	if (*endp <= pstr)
		return 0;
	if ((*endp - pstr) == 2)
		can->can_addr.j1939.addr = tmp64;
	else
		can->can_addr.j1939.name = tmp64;
	if (!**endp)
		return 0;

	str = *endp + 1;
	tmp = strtoul(str, endp, 16);
	if (*endp > str)
		can->can_addr.j1939.pgn = tmp;
	return 0;
}